

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_GetPropertyScoped<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  ImplicitCallFlags flags;
  bool bVar1;
  uint16 uVar2;
  PropertyId propertyId_00;
  ScriptContext *pSVar3;
  ThreadContext *this_00;
  FrameDisplay *this_01;
  InlineCache *inlineCache_00;
  void *aValue;
  FunctionBody *functionBody;
  Var local_98;
  Var value;
  PropertyValueInfo info;
  RecyclableObject *obj;
  int length;
  ScriptContext *scriptContext;
  InlineCache *inlineCache;
  FrameDisplay *pScope;
  PropertyId propertyId;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pSVar3 = GetScriptContext(this);
  this_00 = ScriptContext::GetThreadContext(pSVar3);
  flags = ThreadContext::GetImplicitCallFlags(this_00);
  ThreadContext::ClearImplicitCallFlags(this_00);
  propertyId_00 = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  this_01 = GetEnvForEvalCode(this);
  inlineCache_00 = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  pSVar3 = GetScriptContext(this);
  uVar2 = FrameDisplay::GetLength(this_01);
  if (uVar2 == 1) {
    aValue = FrameDisplay::GetItem(this_01,0);
    info._56_8_ = VarTo<Js::RecyclableObject>(aValue);
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
    functionBody = GetFunctionBody(this);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)&value,functionBody,inlineCache_00,
               (uint)playout->inlineCacheIndex,true);
    bVar1 = CacheOperators::
            TryGetProperty<true,false,false,false,false,false,true,false,false,false>
                      ((Var)info._56_8_,false,(RecyclableObject *)info._56_8_,propertyId_00,
                       &local_98,pSVar3,(PropertyCacheOperationInfo *)0x0,
                       (PropertyValueInfo *)&value);
    if (bVar1) {
      ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
      ThreadContext::AddImplicitCallFlags(this_00,flags);
      SetReg<unsigned_short>(this,playout->Value,local_98);
      return;
    }
  }
  OP_GetPropertyScoped_NoFastPath<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,playout);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  ThreadContext::AddImplicitCallFlags(this_00,flags);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetPropertyScoped(const unaligned OpLayoutT_ElementP<T>* playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        // Get the property, using a scope stack rather than an individual instance.
        // Use the cache
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        FrameDisplay *pScope = this->GetEnvForEvalCode();
        InlineCache *inlineCache = this->GetInlineCache(playout->inlineCacheIndex);
        ScriptContext* scriptContext = GetScriptContext();
        int length = pScope->GetLength();
        if (1 == length)
        {
            RecyclableObject *obj = VarTo<RecyclableObject>(pScope->GetItem(0));
            PropertyValueInfo info;
            PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
            Var value;
            if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
                obj, false, obj, propertyId, &value, scriptContext, nullptr, &info))
            {
                threadContext->CheckAndResetImplicitCallAccessorFlag();
                threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

                SetReg(playout->Value, value);
                return;
            }
        }

        OP_GetPropertyScoped_NoFastPath(playout);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }